

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_imports(lyout *out,lys_module *mod,int *first)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *local_28;
  char *str;
  int *first_local;
  lys_module *mod_local;
  lyout *out_local;
  
  if ((mod->imp_size != '\0') || (mod->inc_size != '\0')) {
    bVar3 = false;
    if (first != (int *)0x0) {
      bVar3 = *first != 0;
    }
    pcVar2 = ",";
    if (bVar3) {
      pcVar2 = "";
    }
    str = (char *)first;
    first_local = (int *)mod;
    mod_local = (lys_module *)out;
    iVar1 = asprintf(&local_28,"%s\"import\":{",pcVar2);
    if (iVar1 == -1) {
      ly_log(*(ly_ctx **)first_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "jsons_print_imports");
    }
    else {
      jsons_print_imports_
                ((lyout *)mod_local,(lys_submodule *)0x0,*(lys_import **)(first_local + 0x18),
                 *(uint8_t *)((long)first_local + 0x45),&local_28);
      if (local_28 == (char *)0x0) {
        ly_print((lyout *)mod_local,"}");
      }
      else {
        free(local_28);
      }
      if (str != (char *)0x0) {
        str[0] = '\0';
        str[1] = '\0';
        str[2] = '\0';
        str[3] = '\0';
      }
    }
  }
  return;
}

Assistant:

static void
jsons_print_imports(struct lyout *out, const struct lys_module *mod, int *first)
{
    char *str;

    if (!mod->imp_size && !mod->inc_size) {
        return;
    }

    if (asprintf(&str, "%s\"import\":{", (first && (*first)) ? "" : ",") == -1) {
        LOGMEM(mod->ctx);
        return;
    }
    jsons_print_imports_(out, NULL, mod->imp, mod->imp_size, &str);
    /* FIXME key duplication in case multiple submodules imports the same module,
     * but the question is if it is needed to print imports even from submodules -
     * similar code should be then added even for typedefs or identities
    for (i = 0; i < mod->inc_size; ++i) {
        jsons_print_imports_(out, mod->inc[i].submodule, mod->inc[i].submodule->imp, mod->inc[i].submodule->imp_size, &str);
    }
    */
    if (str) {
        free(str);
    } else {
        ly_print(out, "}");
    }
    if (first) {
        (*first) = 0;
    }
}